

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scale.cpp
# Opt level: O0

void CoreMLConverter::convertCaffeScale(ConvertLayerParameters layerParameters)

{
  uint64 uVar1;
  uint64 value;
  uint64 uVar2;
  uint64 value_00;
  uint64 uVar3;
  uint64 value_01;
  RepeatedField<float> *pRVar4;
  bool bVar5;
  int iVar6;
  int32 iVar7;
  string *psVar8;
  string *psVar9;
  BlobProto *pBVar10;
  BlobShape *pBVar11;
  reference pvVar12;
  int64 iVar13;
  NeuralNetworkLayer *this;
  ScaleLayerParams *this_00;
  WeightParams *pWVar14;
  RepeatedField<float> *pRVar15;
  BiasLayerParams *this_01;
  NetParameter *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  NeuralNetworkLayer *local_580;
  NeuralNetworkLayer *specLayer_1;
  RepeatedField<float> *local_570;
  RepeatedField<float> *biasWrite_1;
  long *dim_2;
  iterator __end3_1;
  iterator __begin3_1;
  vector<long,_std::allocator<long>_> *__range3_1;
  BiasLayerParams *specLayerParamsBias;
  NeuralNetworkLayer *local_520;
  NeuralNetworkLayer *specLayerBias;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  undefined1 local_4d8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  topMulLayer;
  NeuralNetworkLayer *specLayerMul;
  RepeatedField<float> *local_4b0;
  RepeatedField<float> *biasWrite;
  long *dim_1;
  iterator __end3;
  iterator __begin3;
  vector<long,_std::allocator<long>_> *__range3;
  RepeatedField<float> *local_480;
  RepeatedField<float> *scaleWrite;
  long *dim;
  iterator __end2;
  iterator __begin2;
  vector<long,_std::allocator<long>_> *__range2;
  ScaleLayerParams *specLayerParams;
  NeuralNetworkLayer *specLayer;
  string local_440;
  allocator local_419;
  string local_418;
  allocator local_3f1;
  string local_3f0;
  allocator local_3c9;
  string local_3c8;
  allocator local_3a1;
  string local_3a0;
  int64 local_380;
  int64 local_378;
  int64 local_370;
  int64 local_368;
  int64 local_360;
  int64 local_358;
  int local_350;
  int local_34c;
  int dimSize_1;
  int scaleSize;
  vector<long,_std::allocator<long>_> scaleShape;
  string local_328;
  allocator local_301;
  string local_300;
  allocator local_2d9;
  string local_2d8;
  allocator local_2b1;
  string local_2b0;
  allocator local_289;
  string local_288;
  int64 local_268;
  int64 local_260;
  int64 local_258;
  int64 local_250;
  int64 local_248;
  int64 local_240;
  int local_238;
  int local_234;
  int dimSize;
  int biasSize;
  vector<long,_std::allocator<long>_> biasShape;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  allocator local_199;
  string local_198;
  string local_178;
  allocator local_151;
  string local_150;
  allocator local_129;
  string local_128;
  allocator local_101;
  string local_100;
  uint local_dc;
  byte local_d5;
  int biasLocation;
  undefined1 local_d0 [3];
  bool biasTerm;
  int nBottom;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *nnWrite;
  string local_90;
  allocator local_59;
  string local_58;
  ScaleParameter *local_38;
  ScaleParameter *caffeLayerParams;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *mappingDataBlobNames;
  LayerParameter *caffeLayerWeights;
  LayerParameter *pLStack_18;
  int layerIdWeights;
  LayerParameter *caffeLayer;
  int layerId;
  
  caffeLayer._4_4_ = *(int *)&((layerParameters.caffeNetworkInputNames)->_M_t)._M_impl;
  pLStack_18 = caffe::NetParameter::layer(in_stack_00000008,caffeLayer._4_4_);
  caffeLayerWeights._4_4_ =
       getLayerIndex(pLStack_18,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      *)layerParameters.mappingDataBlobNames);
  mappingDataBlobNames =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)caffe::NetParameter::layer(layerParameters.prototxt,caffeLayerWeights._4_4_);
  caffeLayerParams = (ScaleParameter *)layerParameters._24_8_;
  local_38 = caffe::LayerParameter::scale_param(pLStack_18);
  caffe::LayerParameter::bottom_size(pLStack_18);
  iVar6 = caffe::LayerParameter::bottom_size(pLStack_18);
  if ((iVar6 != 1) && (iVar6 = caffe::LayerParameter::bottom_size(pLStack_18), iVar6 != 2)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,"Must have 1 or 2 input(s)",&local_59);
    psVar8 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    psVar9 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
    errorInCaffeProto(&local_58,psVar8,psVar9);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  iVar6 = caffe::LayerParameter::top_size(pLStack_18);
  if (iVar6 != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_90,"Must have 1 output",(allocator *)((long)&nnWrite + 7));
    psVar8 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    psVar9 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
    errorInCaffeProto(&local_90,psVar8,psVar9);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)((long)&nnWrite + 7));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&top.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_d0);
  psVar8 = caffe::LayerParameter::top_abi_cxx11_(pLStack_18,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_d0,psVar8);
  biasLocation = caffe::LayerParameter::bottom_size(pLStack_18);
  local_d5 = caffe::ScaleParameter::bias_term(local_38);
  local_dc = 0;
  if ((bool)local_d5) {
    local_dc = (uint)(biasLocation == 1);
  }
  if ((((biasLocation == 1) && (!(bool)local_d5)) || ((biasLocation == 2 && ((bool)local_d5)))) &&
     (iVar6 = caffe::LayerParameter::blobs_size((LayerParameter *)mappingDataBlobNames), iVar6 != 1)
     ) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_100,"There must be 1 weight blob",&local_101);
    psVar8 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    psVar9 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
    errorInCaffeProto(&local_100,psVar8,psVar9);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
  }
  if (((biasLocation == 1) && ((local_d5 & 1) != 0)) &&
     (iVar6 = caffe::LayerParameter::blobs_size((LayerParameter *)mappingDataBlobNames), iVar6 != 2)
     ) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_128,"There must be 2 weight blobs",&local_129);
    psVar8 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    psVar9 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
    errorInCaffeProto(&local_128,psVar8,psVar9);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
  }
  iVar7 = caffe::ScaleParameter::axis(local_38);
  if (((iVar7 == 0) || (iVar7 = caffe::ScaleParameter::axis(local_38), iVar7 == -4)) ||
     ((iVar7 = caffe::ScaleParameter::axis(local_38), iVar7 == 3 ||
      (iVar7 = caffe::ScaleParameter::axis(local_38), iVar7 == -1)))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_150,"axis",&local_151);
    psVar8 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    psVar9 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
    iVar7 = caffe::ScaleParameter::axis(local_38);
    std::__cxx11::to_string(&local_178,iVar7);
    unsupportedCaffeParrameterWithOption(&local_150,psVar8,psVar9,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
  }
  iVar7 = caffe::ScaleParameter::axis(local_38);
  if (((iVar7 == 1) || (iVar7 = caffe::ScaleParameter::axis(local_38), iVar7 == -3)) &&
     (biasLocation == 1)) {
    pBVar10 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
    pBVar11 = caffe::BlobProto::shape(pBVar10);
    iVar6 = caffe::BlobShape::dim_size(pBVar11);
    if (iVar6 == 2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_198,"Scale of size 2D when axis = 1 is currently not supported",
                 &local_199);
      psVar8 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
      psVar9 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
      errorInCaffeProto(&local_198,psVar8,psVar9);
      std::__cxx11::string::~string((string *)&local_198);
      std::allocator<char>::~allocator((allocator<char> *)&local_199);
    }
  }
  iVar7 = caffe::ScaleParameter::axis(local_38);
  if (((iVar7 == 1) || (iVar7 = caffe::ScaleParameter::axis(local_38), iVar7 == -3)) &&
     ((local_d5 & 1) != 0)) {
    pBVar10 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,local_dc);
    pBVar11 = caffe::BlobProto::shape(pBVar10);
    iVar6 = caffe::BlobShape::dim_size(pBVar11);
    if (iVar6 == 2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1c0,"Bias of size 2D when axis = 1 is currently not supported",
                 &local_1c1);
      psVar8 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
      psVar9 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
      errorInCaffeProto(&local_1c0,psVar8,psVar9);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
    }
  }
  iVar7 = caffe::ScaleParameter::axis(local_38);
  if (((iVar7 == 2) || (iVar7 = caffe::ScaleParameter::axis(local_38), iVar7 == -2)) &&
     (biasLocation == 1)) {
    pBVar10 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
    pBVar11 = caffe::BlobProto::shape(pBVar10);
    iVar6 = caffe::BlobShape::dim_size(pBVar11);
    if (iVar6 == 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1e8,"Scale of size 1D when axis = 2 is currently not supported",
                 &local_1e9);
      psVar8 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
      psVar9 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
      errorInCaffeProto(&local_1e8,psVar8,psVar9);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    }
  }
  iVar7 = caffe::ScaleParameter::axis(local_38);
  if (((iVar7 == 2) || (iVar7 = caffe::ScaleParameter::axis(local_38), iVar7 == -2)) &&
     ((local_d5 & 1) != 0)) {
    pBVar10 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,local_dc);
    pBVar11 = caffe::BlobProto::shape(pBVar10);
    iVar6 = caffe::BlobShape::dim_size(pBVar11);
    if (iVar6 == 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_210,"Bias of size 1D when axis = 2 is currently not supported",
                 (allocator *)
                 ((long)&biasShape.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      psVar8 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
      psVar9 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
      errorInCaffeProto(&local_210,psVar8,psVar9);
      std::__cxx11::string::~string((string *)&local_210);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&biasShape.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
    }
  }
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)&dimSize);
  local_234 = 1;
  if ((local_d5 & 1) != 0) {
    pBVar10 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,local_dc);
    pBVar11 = caffe::BlobProto::shape(pBVar10);
    local_238 = caffe::BlobShape::dim_size(pBVar11);
    if (local_238 == 0) {
      local_234 = 1;
    }
    else if (local_238 == 1) {
      pBVar10 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,local_dc);
      pBVar11 = caffe::BlobProto::shape(pBVar10);
      local_240 = caffe::BlobShape::dim(pBVar11,0);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)&dimSize,&local_240);
      pvVar12 = std::vector<long,_std::allocator<long>_>::back
                          ((vector<long,_std::allocator<long>_> *)&dimSize);
      local_234 = local_234 * (int)*pvVar12;
    }
    else if (local_238 == 2) {
      pBVar10 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,local_dc);
      pBVar11 = caffe::BlobProto::shape(pBVar10);
      local_248 = caffe::BlobShape::dim(pBVar11,0);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)&dimSize,&local_248);
      pvVar12 = std::vector<long,_std::allocator<long>_>::back
                          ((vector<long,_std::allocator<long>_> *)&dimSize);
      local_234 = local_234 * (int)*pvVar12;
      pBVar10 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,local_dc);
      pBVar11 = caffe::BlobProto::shape(pBVar10);
      local_250 = caffe::BlobShape::dim(pBVar11,1);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)&dimSize,&local_250);
      pvVar12 = std::vector<long,_std::allocator<long>_>::back
                          ((vector<long,_std::allocator<long>_> *)&dimSize);
      local_234 = local_234 * (int)*pvVar12;
    }
    else if ((local_238 == 3) || (local_238 == 4)) {
      pBVar10 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,local_dc);
      pBVar11 = caffe::BlobProto::shape(pBVar10);
      local_258 = caffe::BlobShape::dim(pBVar11,local_238 + -3);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)&dimSize,&local_258);
      pvVar12 = std::vector<long,_std::allocator<long>_>::back
                          ((vector<long,_std::allocator<long>_> *)&dimSize);
      local_234 = local_234 * (int)*pvVar12;
      pBVar10 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,local_dc);
      pBVar11 = caffe::BlobProto::shape(pBVar10);
      local_260 = caffe::BlobShape::dim(pBVar11,local_238 + -2);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)&dimSize,&local_260);
      pvVar12 = std::vector<long,_std::allocator<long>_>::back
                          ((vector<long,_std::allocator<long>_> *)&dimSize);
      local_234 = local_234 * (int)*pvVar12;
      pBVar10 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,local_dc);
      pBVar11 = caffe::BlobProto::shape(pBVar10);
      local_268 = caffe::BlobShape::dim(pBVar11,local_238 + -1);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)&dimSize,&local_268);
      pvVar12 = std::vector<long,_std::allocator<long>_>::back
                          ((vector<long,_std::allocator<long>_> *)&dimSize);
      local_234 = local_234 * (int)*pvVar12;
      if (local_238 == 4) {
        pBVar10 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,local_dc);
        pBVar11 = caffe::BlobProto::shape(pBVar10);
        iVar13 = caffe::BlobShape::dim(pBVar11,0);
        if (iVar13 != 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_288,"bias",&local_289);
          psVar8 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
          psVar9 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_2b0,"4D bias only supported when 1st dimension is 1",
                     &local_2b1);
          unsupportedCaffeParrameterWithOption(&local_288,psVar8,psVar9,&local_2b0);
          std::__cxx11::string::~string((string *)&local_2b0);
          std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
          std::__cxx11::string::~string((string *)&local_288);
          std::allocator<char>::~allocator((allocator<char> *)&local_289);
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2d8,"bias",&local_2d9);
      psVar8 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
      psVar9 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_300,">4D bias not supported",&local_301);
      unsupportedCaffeParrameterWithOption(&local_2d8,psVar8,psVar9,&local_300);
      std::__cxx11::string::~string((string *)&local_300);
      std::allocator<char>::~allocator((allocator<char> *)&local_301);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
    }
    pBVar10 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,local_dc);
    iVar6 = caffe::BlobProto::data_size(pBVar10);
    if (iVar6 != local_234) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_328,"Bias blob data inconsistent with the blob dimensions",
                 (allocator *)
                 ((long)&scaleShape.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      psVar8 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
      psVar9 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
      errorInCaffeProto(&local_328,psVar8,psVar9);
      std::__cxx11::string::~string((string *)&local_328);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&scaleShape.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
    }
  }
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&dimSize_1);
  local_34c = 1;
  if (biasLocation == 1) {
    pBVar10 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
    pBVar11 = caffe::BlobProto::shape(pBVar10);
    local_350 = caffe::BlobShape::dim_size(pBVar11);
    if (local_350 == 0) {
      local_34c = 1;
    }
    else if (local_350 == 1) {
      pBVar10 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
      pBVar11 = caffe::BlobProto::shape(pBVar10);
      local_358 = caffe::BlobShape::dim(pBVar11,0);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)&dimSize_1,&local_358);
      pvVar12 = std::vector<long,_std::allocator<long>_>::back
                          ((vector<long,_std::allocator<long>_> *)&dimSize_1);
      local_34c = local_34c * (int)*pvVar12;
    }
    else if (local_350 == 2) {
      pBVar10 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
      pBVar11 = caffe::BlobProto::shape(pBVar10);
      local_360 = caffe::BlobShape::dim(pBVar11,0);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)&dimSize_1,&local_360);
      pvVar12 = std::vector<long,_std::allocator<long>_>::back
                          ((vector<long,_std::allocator<long>_> *)&dimSize_1);
      local_34c = local_34c * (int)*pvVar12;
      pBVar10 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
      pBVar11 = caffe::BlobProto::shape(pBVar10);
      local_368 = caffe::BlobShape::dim(pBVar11,1);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)&dimSize_1,&local_368);
      pvVar12 = std::vector<long,_std::allocator<long>_>::back
                          ((vector<long,_std::allocator<long>_> *)&dimSize_1);
      local_34c = local_34c * (int)*pvVar12;
    }
    else if ((local_350 == 3) || (local_350 == 4)) {
      pBVar10 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
      pBVar11 = caffe::BlobProto::shape(pBVar10);
      local_370 = caffe::BlobShape::dim(pBVar11,local_350 + -3);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)&dimSize_1,&local_370);
      pvVar12 = std::vector<long,_std::allocator<long>_>::back
                          ((vector<long,_std::allocator<long>_> *)&dimSize_1);
      local_34c = local_34c * (int)*pvVar12;
      pBVar10 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
      pBVar11 = caffe::BlobProto::shape(pBVar10);
      local_378 = caffe::BlobShape::dim(pBVar11,local_350 + -2);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)&dimSize_1,&local_378);
      pvVar12 = std::vector<long,_std::allocator<long>_>::back
                          ((vector<long,_std::allocator<long>_> *)&dimSize_1);
      local_34c = local_34c * (int)*pvVar12;
      pBVar10 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
      pBVar11 = caffe::BlobProto::shape(pBVar10);
      local_380 = caffe::BlobShape::dim(pBVar11,local_350 + -1);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)&dimSize_1,&local_380);
      pvVar12 = std::vector<long,_std::allocator<long>_>::back
                          ((vector<long,_std::allocator<long>_> *)&dimSize_1);
      local_34c = local_34c * (int)*pvVar12;
      if (local_350 == 4) {
        pBVar10 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
        pBVar11 = caffe::BlobProto::shape(pBVar10);
        iVar13 = caffe::BlobShape::dim(pBVar11,0);
        if (iVar13 != 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_3a0,"scale",&local_3a1);
          psVar8 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
          psVar9 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_3c8,"4D scale only supported when 1st dimension is 1",
                     &local_3c9);
          unsupportedCaffeParrameterWithOption(&local_3a0,psVar8,psVar9,&local_3c8);
          std::__cxx11::string::~string((string *)&local_3c8);
          std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
          std::__cxx11::string::~string((string *)&local_3a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3f0,"scale",&local_3f1);
      psVar8 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
      psVar9 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_418,">4D scale not supported",&local_419);
      unsupportedCaffeParrameterWithOption(&local_3f0,psVar8,psVar9,&local_418);
      std::__cxx11::string::~string((string *)&local_418);
      std::allocator<char>::~allocator((allocator<char> *)&local_419);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
    }
    pBVar10 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
    iVar6 = caffe::BlobProto::data_size(pBVar10);
    if (iVar6 != local_34c) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_440,"Scale blob data size inconsistent with the  blob dimensions",
                 (allocator *)((long)&specLayer + 7));
      psVar8 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
      psVar9 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
      errorInCaffeProto(&local_440,psVar8,psVar9);
      std::__cxx11::string::~string((string *)&local_440);
      std::allocator<char>::~allocator((allocator<char> *)((long)&specLayer + 7));
    }
  }
  if (biasLocation == 1) {
    this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                     ((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
                      layerParameters.protoweights);
    psVar8 = caffe::LayerParameter::bottom_abi_cxx11_(pLStack_18,0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&top.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar8);
    psVar8 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    convertCaffeMetadata
              (psVar8,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&top.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_d0,
               (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
               layerParameters.protoweights,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)caffeLayerParams);
    this_00 = CoreML::Specification::NeuralNetworkLayer::mutable_scale(this);
    __end2 = std::vector<long,_std::allocator<long>_>::begin
                       ((vector<long,_std::allocator<long>_> *)&dimSize_1);
    dim = (long *)std::vector<long,_std::allocator<long>_>::end
                            ((vector<long,_std::allocator<long>_> *)&dimSize_1);
    while (bVar5 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                       *)&dim), bVar5) {
      scaleWrite = (RepeatedField<float> *)
                   __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                   operator*(&__end2);
      uVar1._0_4_ = scaleWrite->current_size_;
      uVar1._4_4_ = scaleWrite->total_size_;
      if ((long)uVar1 < 0) {
        __assert_fail("dim >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Scale.cpp"
                      ,0xd4,
                      "void CoreMLConverter::convertCaffeScale(CoreMLConverter::ConvertLayerParameters)"
                     );
      }
      value._0_4_ = scaleWrite->current_size_;
      value._4_4_ = scaleWrite->total_size_;
      CoreML::Specification::ScaleLayerParams::add_shapescale(this_00,value);
      __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
                (&__end2);
    }
    pWVar14 = CoreML::Specification::ScaleLayerParams::mutable_scale(this_00);
    local_480 = CoreML::Specification::WeightParams::mutable_floatvalue(pWVar14);
    __range3._4_4_ = 0;
    google::protobuf::RepeatedField<float>::Resize
              (local_480,local_34c,(float *)((long)&__range3 + 4));
    pRVar4 = local_480;
    pBVar10 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
    pRVar15 = caffe::BlobProto::data(pBVar10);
    google::protobuf::RepeatedField<float>::CopyFrom(pRVar4,pRVar15);
    if ((local_d5 & 1) != 0) {
      CoreML::Specification::ScaleLayerParams::set_hasbias(this_00,true);
      __end3 = std::vector<long,_std::allocator<long>_>::begin
                         ((vector<long,_std::allocator<long>_> *)&dimSize);
      dim_1 = (long *)std::vector<long,_std::allocator<long>_>::end
                                ((vector<long,_std::allocator<long>_> *)&dimSize);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                         *)&dim_1), bVar5) {
        biasWrite = (RepeatedField<float> *)
                    __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                    ::operator*(&__end3);
        uVar2._0_4_ = biasWrite->current_size_;
        uVar2._4_4_ = biasWrite->total_size_;
        if ((long)uVar2 < 0) {
          __assert_fail("dim >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Scale.cpp"
                        ,0xdd,
                        "void CoreMLConverter::convertCaffeScale(CoreMLConverter::ConvertLayerParameters)"
                       );
        }
        value_00._0_4_ = biasWrite->current_size_;
        value_00._4_4_ = biasWrite->total_size_;
        CoreML::Specification::ScaleLayerParams::add_shapebias(this_00,value_00);
        __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
                  (&__end3);
      }
      pWVar14 = CoreML::Specification::ScaleLayerParams::mutable_bias(this_00);
      local_4b0 = CoreML::Specification::WeightParams::mutable_floatvalue(pWVar14);
      specLayerMul._4_4_ = 0;
      google::protobuf::RepeatedField<float>::Resize
                (local_4b0,local_234,(float *)((long)&specLayerMul + 4));
      pRVar4 = local_4b0;
      pBVar10 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,1);
      pRVar15 = caffe::BlobProto::data(pBVar10);
      google::protobuf::RepeatedField<float>::CopyFrom(pRVar4,pRVar15);
    }
  }
  else if ((local_d5 & 1) == 0) {
    local_580 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                          ((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
                           layerParameters.protoweights);
    psVar8 = caffe::LayerParameter::bottom_abi_cxx11_(pLStack_18,0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&top.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar8);
    psVar8 = caffe::LayerParameter::bottom_abi_cxx11_(pLStack_18,1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&top.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar8);
    psVar8 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    std::operator+(&local_5a0,psVar8,"_Mul");
    convertCaffeMetadata
              (&local_5a0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&top.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_d0,
               (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
               layerParameters.protoweights,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)caffeLayerParams);
    std::__cxx11::string::~string((string *)&local_5a0);
    CoreML::Specification::NeuralNetworkLayer::mutable_multiply(local_580);
  }
  else {
    topMulLayer.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                            ((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
                             layerParameters.protoweights);
    psVar8 = caffe::LayerParameter::bottom_abi_cxx11_(pLStack_18,0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&top.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar8);
    psVar8 = caffe::LayerParameter::bottom_abi_cxx11_(pLStack_18,1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&top.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_4d8);
    psVar8 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    std::operator+(&local_4f8,psVar8,"_Mul_output");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_4d8,&local_4f8);
    std::__cxx11::string::~string((string *)&local_4f8);
    psVar8 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &specLayerBias,psVar8,"_Mul");
    convertCaffeMetadata
              ((string *)&specLayerBias,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&top.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_4d8,
               (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
               layerParameters.protoweights,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)caffeLayerParams);
    std::__cxx11::string::~string((string *)&specLayerBias);
    CoreML::Specification::NeuralNetworkLayer::mutable_multiply
              ((NeuralNetworkLayer *)
               topMulLayer.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_520 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                          ((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
                           layerParameters.protoweights);
    psVar8 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &specLayerParamsBias,psVar8,"_Bias");
    convertCaffeMetadata
              ((string *)&specLayerParamsBias,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_4d8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_d0,
               (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
               layerParameters.protoweights,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)caffeLayerParams);
    std::__cxx11::string::~string((string *)&specLayerParamsBias);
    this_01 = CoreML::Specification::NeuralNetworkLayer::mutable_bias(local_520);
    __end3_1 = std::vector<long,_std::allocator<long>_>::begin
                         ((vector<long,_std::allocator<long>_> *)&dimSize);
    dim_2 = (long *)std::vector<long,_std::allocator<long>_>::end
                              ((vector<long,_std::allocator<long>_> *)&dimSize);
    while (bVar5 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                               *)&dim_2), bVar5) {
      biasWrite_1 = (RepeatedField<float> *)
                    __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                    ::operator*(&__end3_1);
      uVar3._0_4_ = biasWrite_1->current_size_;
      uVar3._4_4_ = biasWrite_1->total_size_;
      if ((long)uVar3 < 0) {
        __assert_fail("dim >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Scale.cpp"
                      ,0xf6,
                      "void CoreMLConverter::convertCaffeScale(CoreMLConverter::ConvertLayerParameters)"
                     );
      }
      value_01._0_4_ = biasWrite_1->current_size_;
      value_01._4_4_ = biasWrite_1->total_size_;
      CoreML::Specification::BiasLayerParams::add_shape(this_01,value_01);
      __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
                (&__end3_1);
    }
    pWVar14 = CoreML::Specification::BiasLayerParams::mutable_bias(this_01);
    local_570 = CoreML::Specification::WeightParams::mutable_floatvalue(pWVar14);
    specLayer_1._4_4_ = 0;
    google::protobuf::RepeatedField<float>::Resize
              (local_570,local_234,(float *)((long)&specLayer_1 + 4));
    pRVar4 = local_570;
    pBVar10 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
    pRVar15 = caffe::BlobProto::data(pBVar10);
    google::protobuf::RepeatedField<float>::CopyFrom(pRVar4,pRVar15);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_4d8);
  }
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)&dimSize_1);
  std::vector<long,_std::allocator<long>_>::~vector((vector<long,_std::allocator<long>_> *)&dimSize)
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&top.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeScale(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    const caffe::ScaleParameter& caffeLayerParams =  caffeLayer.scale_param();
    
    #pragma unused(caffeLayerWeights)
    
    /* CoreML Scale layer does not support all the functionality of Caffe Scale layer.
     Certain error modes can only be detected at compile time when we have input shapes available.
     Such errors cannot be detected at conversion time.
     */
    if (caffeLayer.bottom_size() == 2){
        /*
        WARNING: Caffe Scale layer is currently not fully supported in CoreML.
        Conversion will proceed but certain modes exercised in Caffe may lead to error during compilation/runtime.
        Please refer to the CoreML documentation to see what is supported.
         */
    }
    
    /*
     Caffe can have scale as either an additional input or as a learned parameter. If former, there will be 2 bottoms,
     otherwise 1.
     if bottom_size == 1 => add an CoreML "scale" layer
     if bottom_size == 2 => add an MLkit "multiply" layer. If bias term is true then add another CoreML "bias" layer as well.
     */
   
    if (! (caffeLayer.bottom_size() == 1 || caffeLayer.bottom_size() == 2)){
        CoreMLConverter::errorInCaffeProto("Must have 1 or 2 input(s)",caffeLayer.name(),caffeLayer.type());
    }
    if (caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 output",caffeLayer.name(),caffeLayer.type());
    }
    
    auto* nnWrite = layerParameters.nnWrite;
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    top.push_back(caffeLayer.top(0));
    
    int nBottom = caffeLayer.bottom_size();
    bool biasTerm = caffeLayerParams.bias_term();
    
    int biasLocation = 0;
    if (biasTerm) {
        if (nBottom == 1){
            biasLocation = 1;
        }
    }
    
    //***************** Some Error Checking in Caffe Proto **********
    if ((nBottom == 1 && !biasTerm) || (nBottom == 2 && biasTerm)){
        if (caffeLayerWeights.blobs_size() != 1){
            CoreMLConverter::errorInCaffeProto("There must be 1 weight blob",caffeLayer.name(),caffeLayer.type());
        }
    }
    if (nBottom == 1 && biasTerm){
        if (caffeLayerWeights.blobs_size() != 2){
            CoreMLConverter::errorInCaffeProto("There must be 2 weight blobs",caffeLayer.name(),caffeLayer.type());
        }
    }
    if (caffeLayerParams.axis() == 0 || caffeLayerParams.axis() == -4 ||
        caffeLayerParams.axis() == 3 || caffeLayerParams.axis() == -1 ) {
        CoreMLConverter::unsupportedCaffeParrameterWithOption("axis",caffeLayer.name(),caffeLayer.type(),
                                                             std::to_string(caffeLayerParams.axis()));
    }
    if (caffeLayerParams.axis() == 1 || caffeLayerParams.axis() == -3){
        if (nBottom == 1){
            if (caffeLayerWeights.blobs(0).shape().dim_size() == 2){
                CoreMLConverter::errorInCaffeProto("Scale of size 2D when axis = 1 is currently not supported",
                                                  caffeLayer.name(),caffeLayer.type());
            }
        }
    }
    if (caffeLayerParams.axis() == 1 || caffeLayerParams.axis() == -3){
        if (biasTerm){
            if (caffeLayerWeights.blobs(biasLocation).shape().dim_size() == 2){
                CoreMLConverter::errorInCaffeProto("Bias of size 2D when axis = 1 is currently not supported",
                                                  caffeLayer.name(),caffeLayer.type());
            }
        }
    }
    if (caffeLayerParams.axis() == 2 || caffeLayerParams.axis() == -2){
        if (nBottom == 1){
            if (caffeLayerWeights.blobs(0).shape().dim_size() == 1){
                CoreMLConverter::errorInCaffeProto("Scale of size 1D when axis = 2 is currently not supported",
                                                  caffeLayer.name(),caffeLayer.type());
            }
        }
    }
    if (caffeLayerParams.axis() == 2 || caffeLayerParams.axis() == -2){
        if (biasTerm){
            if (caffeLayerWeights.blobs(biasLocation).shape().dim_size() == 1){
                CoreMLConverter::errorInCaffeProto("Bias of size 1D when axis = 2 is currently not supported",
                                                  caffeLayer.name(),caffeLayer.type());
            }
        }
    }
    //***************************************************************
    
    /*
     Get params related to the bias
     */
    std::vector<int64_t> biasShape;
    int biasSize = 1;
    if (biasTerm) {

        int dimSize = caffeLayerWeights.blobs(biasLocation).shape().dim_size();
        
        if (dimSize == 0){
            biasSize = 1;
        } else if (dimSize == 1){
            biasShape.push_back(caffeLayerWeights.blobs(biasLocation).shape().dim(0));
            biasSize *= biasShape.back();
        } else if (dimSize == 2){
            biasShape.push_back(caffeLayerWeights.blobs(biasLocation).shape().dim(0));
            biasSize *= biasShape.back();
            biasShape.push_back(caffeLayerWeights.blobs(biasLocation).shape().dim(1));
            biasSize *= biasShape.back();
        } else if (dimSize == 3 || dimSize == 4){
            biasShape.push_back(caffeLayerWeights.blobs(biasLocation).shape().dim(dimSize-3));
            biasSize *= biasShape.back();
            biasShape.push_back(caffeLayerWeights.blobs(biasLocation).shape().dim(dimSize-2));
            biasSize *= biasShape.back();
            biasShape.push_back(caffeLayerWeights.blobs(biasLocation).shape().dim(dimSize-1));
            biasSize *= biasShape.back();
            if (dimSize == 4 && caffeLayerWeights.blobs(biasLocation).shape().dim(0) != 1) {
                CoreMLConverter::unsupportedCaffeParrameterWithOption("bias",caffeLayer.name(),caffeLayer.type(),
                                                                     "4D bias only supported when 1st dimension is 1");
            }
        } else {
            CoreMLConverter::unsupportedCaffeParrameterWithOption("bias",caffeLayer.name(),caffeLayer.type(),
                                                                 ">4D bias not supported");
        }
        if (caffeLayerWeights.blobs(biasLocation).data_size() != biasSize){
            CoreMLConverter::errorInCaffeProto("Bias blob data inconsistent with the blob dimensions",caffeLayer.name(),caffeLayer.type());
        }
    }
    
    /*
     Get params related to scale when it is a learned parameter
     */
    std::vector<int64_t> scaleShape;
    int scaleSize = 1;
    if (nBottom == 1) {
        
        int dimSize = caffeLayerWeights.blobs(0).shape().dim_size();
        
        if (dimSize == 0){
            scaleSize = 1;
        } else if (dimSize == 1){
            scaleShape.push_back(caffeLayerWeights.blobs(0).shape().dim(0));
            scaleSize *= scaleShape.back();
        } else if (dimSize == 2){
            scaleShape.push_back(caffeLayerWeights.blobs(0).shape().dim(0));
            scaleSize *= scaleShape.back();
            scaleShape.push_back(caffeLayerWeights.blobs(0).shape().dim(1));
            scaleSize *= scaleShape.back();
        } else if (dimSize == 3 || dimSize == 4){
            scaleShape.push_back(caffeLayerWeights.blobs(0).shape().dim(dimSize-3));
            scaleSize *= scaleShape.back();
            scaleShape.push_back(caffeLayerWeights.blobs(0).shape().dim(dimSize-2));
            scaleSize *= scaleShape.back();
            scaleShape.push_back(caffeLayerWeights.blobs(0).shape().dim(dimSize-1));
            scaleSize *= scaleShape.back();
            if (dimSize == 4 && caffeLayerWeights.blobs(0).shape().dim(0) != 1) {
                CoreMLConverter::unsupportedCaffeParrameterWithOption("scale",caffeLayer.name(),caffeLayer.type(),
                                                                     "4D scale only supported when 1st dimension is 1");
            }
        } else {
            CoreMLConverter::unsupportedCaffeParrameterWithOption("scale",caffeLayer.name(),caffeLayer.type(),
                                                                 ">4D scale not supported");
        }
        if (caffeLayerWeights.blobs(0).data_size() != scaleSize){
            CoreMLConverter::errorInCaffeProto("Scale blob data size inconsistent with the  blob dimensions",caffeLayer.name(),caffeLayer.type());
        }
    }
    
    /*
     Add appropriate CoreML layer(s) now
     */
    
    if (nBottom == 1){
        Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
        bottom.push_back(caffeLayer.bottom(0));
        CoreMLConverter::convertCaffeMetadata(caffeLayer.name(), 
                                             bottom, top,
                                             nnWrite, mappingDataBlobNames);
        
        Specification::ScaleLayerParams* specLayerParams = specLayer->mutable_scale();
        for (const auto& dim: scaleShape){
            assert(dim >= 0);
            specLayerParams->add_shapescale(static_cast<uint64_t>(dim));
        }
        ::google::protobuf::RepeatedField<float>* scaleWrite = specLayerParams->mutable_scale()->mutable_floatvalue();
        scaleWrite->Resize(scaleSize, 0.0);
        scaleWrite->CopyFrom(caffeLayerWeights.blobs(0).data());
        if (biasTerm) {
            specLayerParams->set_hasbias(true);
            for (const auto& dim: biasShape){
                assert(dim >= 0);
                specLayerParams->add_shapebias(static_cast<uint64_t>(dim));
            }
            ::google::protobuf::RepeatedField<float>* biasWrite = specLayerParams->mutable_bias()->mutable_floatvalue();
            biasWrite->Resize(biasSize, 0.0);
            biasWrite->CopyFrom(caffeLayerWeights.blobs(1).data());
        }
    } else if (biasTerm) {
        Specification::NeuralNetworkLayer* specLayerMul = nnWrite->Add();
        bottom.push_back(caffeLayer.bottom(0));
        bottom.push_back(caffeLayer.bottom(1));
        std::vector<std::string> topMulLayer;
        topMulLayer.push_back(caffeLayer.name() + "_Mul_output");
        CoreMLConverter::convertCaffeMetadata(caffeLayer.name() + "_Mul",
                                             bottom, topMulLayer,
                                             nnWrite, mappingDataBlobNames);
        
        (void) specLayerMul->mutable_multiply();
        Specification::NeuralNetworkLayer* specLayerBias = nnWrite->Add();
        CoreMLConverter::convertCaffeMetadata(caffeLayer.name() + "_Bias",
                                             topMulLayer, top,
                                             nnWrite, mappingDataBlobNames);
        
        Specification::BiasLayerParams* specLayerParamsBias = specLayerBias->mutable_bias();
        for (const auto& dim: biasShape){
            assert(dim >= 0);
            specLayerParamsBias->add_shape(static_cast<uint64_t>(dim));
        }
        ::google::protobuf::RepeatedField<float>* biasWrite = specLayerParamsBias->mutable_bias()->mutable_floatvalue();
        biasWrite->Resize(biasSize, 0.0);
        biasWrite->CopyFrom(caffeLayerWeights.blobs(0).data());
    } else {
        Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
        bottom.push_back(caffeLayer.bottom(0));
        bottom.push_back(caffeLayer.bottom(1));
        CoreMLConverter::convertCaffeMetadata(caffeLayer.name() + "_Mul", 
                                             bottom, top,
                                             nnWrite, mappingDataBlobNames);
        (void) specLayer->mutable_multiply();
    }
}